

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O0

void mahjong::adjust_by_waiting_form
               (pack_t *concealed_packs,intptr_t pack_cnt,tile_t *standing_tiles,
               intptr_t standing_cnt,tile_t win_tile,fan_table_t *fan_table)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool *pbVar5;
  bool *pbVar6;
  bool *pbVar7;
  bool *pbVar8;
  difference_type dVar9;
  tile_t mid_tile_1;
  long lStack_e8;
  tile_t mid_tile;
  intptr_t i;
  bool local_d8 [5];
  uint8_t pos_flag;
  useful_table_t temp_table;
  bool local_88 [8];
  useful_table_t waiting_table;
  fan_table_t *fan_table_local;
  tile_t win_tile_local;
  intptr_t standing_cnt_local;
  tile_t *standing_tiles_local;
  intptr_t pack_cnt_local;
  pack_t *concealed_packs_local;
  
  if ((((*fan_table)[0x34] == 0) && ((*fan_table)[5] == 0)) &&
     (waiting_table._64_8_ = fan_table,
     bVar3 = is_basic_form_wait(standing_tiles,standing_cnt,(useful_table_t *)local_88), bVar3)) {
    if ((pack_cnt == 5) &&
       (bVar3 = is_seven_pairs_wait(standing_tiles,standing_cnt,(useful_table_t *)local_d8), bVar3))
    {
      pbVar7 = std::begin<bool,72ul>((bool (*) [72])local_d8);
      pbVar8 = std::end<bool,72ul>((bool (*) [72])local_d8);
      pbVar5 = std::begin<bool,72ul>((bool (*) [72])local_88);
      pbVar6 = std::begin<bool,72ul>((bool (*) [72])local_88);
      std::
      transform<bool*,bool*,bool*,mahjong::adjust_by_waiting_form(unsigned_short_const*,long,unsigned_char_const*,long,unsigned_char,unsigned_short(&)[83])::__0>
                (pbVar7,pbVar8,pbVar5,pbVar6);
    }
    pbVar7 = std::begin<bool,72ul>((bool (*) [72])local_88);
    pbVar8 = std::end<bool,72ul>((bool (*) [72])local_88);
    i._6_1_ = 1;
    dVar9 = std::count<bool*,bool>(pbVar7,pbVar8,(bool *)((long)&i + 6));
    if (dVar9 == 1) {
      bVar2 = false;
      bVar1 = false;
      bVar3 = false;
      for (lStack_e8 = 0; lStack_e8 < pack_cnt; lStack_e8 = lStack_e8 + 1) {
        concealed_packs_local._7_1_ = (byte)(concealed_packs[lStack_e8] >> 8);
        if ((concealed_packs_local._7_1_ & 0xf) == 1) {
          bVar4 = (byte)concealed_packs[lStack_e8];
          if (bVar4 == win_tile) {
            bVar1 = true;
          }
          else if ((bVar4 + 1 == (uint)win_tile) || (bVar4 - 1 == (uint)win_tile)) {
            bVar3 = true;
          }
        }
        else if (((concealed_packs_local._7_1_ & 0xf) == 4) &&
                ((tile_t)concealed_packs[lStack_e8] == win_tile)) {
          bVar2 = true;
        }
      }
      if (bVar3) {
        *(undefined2 *)(waiting_table._64_8_ + 0x9a) = 1;
      }
      else if (bVar1) {
        *(undefined2 *)(waiting_table._64_8_ + 0x9c) = 1;
      }
      else if (bVar2) {
        *(undefined2 *)(waiting_table._64_8_ + 0x9e) = 1;
      }
    }
  }
  return;
}

Assistant:

static void adjust_by_waiting_form(const pack_t *concealed_packs, intptr_t pack_cnt, const tile_t *standing_tiles, intptr_t standing_cnt,
    tile_t win_tile, fan_table_t &fan_table) {
    // 全求人和四杠不计单钓将，也不可能有边张、嵌张
    if (fan_table[MELDED_HAND] || fan_table[FOUR_KONGS]) {
        return;
    }

    useful_table_t waiting_table;  // 听牌标记表
    if (!is_basic_form_wait(standing_tiles, standing_cnt, &waiting_table)) {
        return;
    }

    if (pack_cnt == 5) {  // 门清状态
        // 判断是否为七对听牌
        useful_table_t temp_table;
        if (is_seven_pairs_wait(standing_tiles, standing_cnt, &temp_table)) {
            // 合并听牌标记表
            std::transform(std::begin(temp_table), std::end(temp_table), std::begin(waiting_table),
                std::begin(waiting_table), [](bool w, bool t) { return w || t; });
        }
    }

    // 统计听牌张数，听牌数大于1张，不计边张、嵌张、单钓将
    if (1 != std::count(std::begin(waiting_table), std::end(waiting_table), true)) {
        return;
    }

    // 听1张的情况，看和牌张处于什么位置
    // 边张0x01 嵌张0x02 单钓将0x04
    uint8_t pos_flag = 0;

    for (intptr_t i = 0; i < pack_cnt; ++i) {
        switch (pack_get_type(concealed_packs[i])) {
        case PACK_TYPE_CHOW: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x02U;  // 嵌张
            }
            else if (mid_tile + 1 == win_tile || mid_tile - 1 == win_tile) {
                pos_flag |= 0x01U;  // 边张
            }
            break;
        }
        case PACK_TYPE_PAIR: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x04U;  // 单钓将
            }
            break;
        }
        default:
            break;
        }
    }

    // 当多种可能存在时，只能计其中一种
    if (pos_flag & 0x01U) {
        fan_table[EDGE_WAIT] = 1;
    }
    else if (pos_flag & 0x02U) {
        fan_table[CLOSED_WAIT] = 1;
    }
    else if (pos_flag & 0x04U) {
        fan_table[SINGLE_WAIT] = 1;
    }
}